

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_encode.c
# Opt level: O0

void base64_encode_bs(BinarySink *bs,ptrlen input,int cpl)

{
  size_t local_90;
  ulong local_88;
  size_t i;
  undefined1 auStack_78 [4];
  char b64atom [4];
  ptrlen binatom;
  size_t n;
  undefined1 local_58 [4];
  int linelen;
  BinarySource src [1];
  int cpl_local;
  BinarySink *bs_local;
  ptrlen input_local;
  
  BinarySource_INIT__((BinarySource *)local_58,input);
  n._4_4_ = 0;
  while (*(long *)(src[0]._24_8_ + 0x10) != *(long *)(src[0]._24_8_ + 8)) {
    if ((ulong)(*(long *)(src[0]._24_8_ + 0x10) - *(long *)(src[0]._24_8_ + 8)) < 3) {
      local_90 = *(long *)(src[0]._24_8_ + 0x10) - *(long *)(src[0]._24_8_ + 8);
    }
    else {
      local_90 = 3;
    }
    _auStack_78 = BinarySource_get_data((BinarySource *)src[0]._24_8_,local_90);
    base64_encode_atom(_auStack_78,auStack_78._8_4_,(char *)((long)&i + 4));
    for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
      if ((0 < cpl) && (cpl <= n._4_4_)) {
        n._4_4_ = 0;
        BinarySink_put_byte(bs->binarysink_,'\n');
      }
      BinarySink_put_byte(bs->binarysink_,auStack_78[local_88 - 4]);
      n._4_4_ = n._4_4_ + 1;
    }
  }
  if (0 < cpl) {
    BinarySink_put_byte(bs->binarysink_,'\n');
  }
  return;
}

Assistant:

void base64_encode_bs(BinarySink *bs, ptrlen input, int cpl)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, input);
    int linelen = 0;

    while (get_avail(src)) {
        size_t n = get_avail(src) < 3 ? get_avail(src) : 3;
        ptrlen binatom = get_data(src, n);

        char b64atom[4];
        base64_encode_atom(binatom.ptr, binatom.len, b64atom);
        for (size_t i = 0; i < 4; i++) {
            if (cpl > 0 && linelen >= cpl) {
                linelen = 0;
                put_byte(bs, '\n');
            }
            put_byte(bs, b64atom[i]);
            linelen++;
        }
    }
    if (cpl > 0)
        put_byte(bs, '\n');
}